

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterThunkEmitter.cpp
# Opt level: O2

void InterpreterThunkEmitter::EncodeInterpreterThunk
               (BYTE *thunkBuffer,intptr_t thunkBufferStartAddress,intptr_t epilogStart,
               DWORD epilogSize,intptr_t interpreterThunk)

{
  Emit<unsigned_long>(thunkBuffer,0x3d,interpreterThunk);
  thunkBuffer[0xf] = 'p';
  thunkBuffer[7] = '(';
  thunkBuffer[0xb] = '\b';
  Emit<unsigned_long>(thunkBuffer,0x19,thunkBufferStartAddress + 0x48U);
  Emit<unsigned_int>(thunkBuffer,0x27,(int)epilogStart - (int)(thunkBufferStartAddress + 0x48U));
  Emit<unsigned_char>(thunkBuffer,0x30,'\x05');
  return;
}

Assistant:

void InterpreterThunkEmitter::EncodeInterpreterThunk(
    __in_bcount(InterpreterThunkSize) BYTE* thunkBuffer,
    __in const intptr_t thunkBufferStartAddress,
    __in const intptr_t epilogStart,
    __in const DWORD epilogSize,
    __in const intptr_t interpreterThunk)
{
    Emit(thunkBuffer, ThunkAddressOffset, (uintptr_t)interpreterThunk);
    thunkBuffer[DynamicThunkAddressOffset] = Js::FunctionBody::GetOffsetOfDynamicInterpreterThunk();
    thunkBuffer[FunctionInfoOffset] = Js::JavascriptFunction::GetOffsetOfFunctionInfo();
    thunkBuffer[FunctionProxyOffset] = Js::FunctionInfo::GetOffsetOfFunctionProxy();
    Emit(thunkBuffer, CallBlockStartAddrOffset, (uintptr_t) thunkBufferStartAddress + HeaderSize);
    uint totalThunkSize = (uint)(epilogStart - (thunkBufferStartAddress + HeaderSize));
    Emit(thunkBuffer, ThunkSizeOffset, totalThunkSize);
    Emit(thunkBuffer, ErrorOffset, (BYTE) FAST_FAIL_INVALID_ARG);
}